

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffmahd(fitsfile *fptr,int hdunum,int *exttype,int *status)

{
  int iVar1;
  LONGLONG *pLVar2;
  FITSfile *pFVar3;
  int iVar4;
  int tstatus;
  char message [81];
  int local_8c;
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (hdunum < 1) {
    *status = 0x12d;
    iVar4 = 0x12d;
  }
  else {
    pFVar3 = fptr->Fptr;
    if (pFVar3->MAXHDU <= hdunum) {
      pLVar2 = (LONGLONG *)realloc(pFVar3->headstart,(ulong)(uint)hdunum * 8 + 0x1f48);
      if (pLVar2 == (LONGLONG *)0x0) {
        *status = 0x71;
        return 0x71;
      }
      pFVar3 = fptr->Fptr;
      pFVar3->MAXHDU = hdunum + 1000;
      pFVar3->headstart = pLVar2;
    }
    fptr->HDUposition = pFVar3->curhdu;
    do {
      pFVar3 = fptr->Fptr;
      if (pFVar3->curhdu + 1 == hdunum) {
        if (exttype != (int *)0x0) {
          ffghdt(fptr,exttype,status);
        }
        goto LAB_00140c0c;
      }
      iVar4 = pFVar3->maxhdu + 1;
      if (hdunum <= iVar4) {
        iVar4 = hdunum + -1;
      }
      if (pFVar3->logfilesize <= pFVar3->headstart[iVar4]) {
        *status = 0x6b;
        return 0x6b;
      }
      iVar1 = ffchdu(fptr,status);
      if ((iVar1 < 1) && (iVar4 = ffgext(fptr,iVar4,exttype,status), 0 < iVar4)) {
        local_8c = 0;
        ffrhdu(fptr,exttype,&local_8c);
      }
    } while (*status < 1);
    iVar4 = 0x6b;
    if (*status != 0x6b) {
      snprintf(local_88,0x51,"Failed to move to HDU number %d (ffmahd).",(ulong)(uint)hdunum);
      ffxmsg(5,local_88);
LAB_00140c0c:
      iVar4 = *status;
    }
  }
  return iVar4;
}

Assistant:

int ffmahd(fitsfile *fptr,      /* I - FITS file pointer             */
           int hdunum,          /* I - number of the HDU to move to  */
           int *exttype,        /* O - type of extension, 0, 1, or 2 */
           int *status)         /* IO - error status                 */
/*
  Move to Absolute Header Data unit.  Move to the specified HDU
  and read the header to initialize the table structure.  Note that extnum 
  is one based, so the primary array is extnum = 1.
*/
{
    int moveto, tstatus;
    char message[FLEN_ERRMSG];
    LONGLONG *ptr;

    if (*status > 0)
        return(*status);
    else if (hdunum < 1 )
        return(*status = BAD_HDU_NUM);
    else if (hdunum >= (fptr->Fptr)->MAXHDU )
    {
        /* allocate more space for the headstart array */
        ptr = (LONGLONG*) realloc( (fptr->Fptr)->headstart,
                        (hdunum + 1001) * sizeof(LONGLONG) ); 

        if (ptr == NULL)
           return (*status = MEMORY_ALLOCATION);
        else {
          (fptr->Fptr)->MAXHDU = hdunum + 1000; 
          (fptr->Fptr)->headstart = ptr;
        }
    }

    /* set logical HDU position to the actual position, in case they differ */
    fptr->HDUposition = (fptr->Fptr)->curhdu;

    while( ((fptr->Fptr)->curhdu) + 1 != hdunum) /* at the correct HDU? */
    {
        /* move directly to the extension if we know that it exists,
           otherwise move to the highest known extension.  */
        
        moveto = minvalue(hdunum - 1, ((fptr->Fptr)->maxhdu) + 1);

        /* test if HDU exists */
        if ((fptr->Fptr)->headstart[moveto] < (fptr->Fptr)->logfilesize )
        {
            if (ffchdu(fptr, status) <= 0)  /* close out the current HDU */
            {
                if (ffgext(fptr, moveto, exttype, status) > 0)
                {   /* failed to get the requested extension */

                    tstatus = 0;
                    ffrhdu(fptr, exttype, &tstatus); /* restore the CHDU */
                }
            }
        }
        else
            *status = END_OF_FILE;

        if (*status > 0)
        {
            if (*status != END_OF_FILE)
            {
                /* don't clutter up the message stack in the common case of */
                /* simply hitting the end of file (often an expected error) */

                snprintf(message,FLEN_ERRMSG,
                "Failed to move to HDU number %d (ffmahd).", hdunum);
                ffpmsg(message);
            }
            return(*status);
        }
    }

    /* return the type of HDU; tile compressed images which are stored */
    /* in a binary table will return exttype = IMAGE_HDU, not BINARY_TBL */
    if (exttype != NULL)
        ffghdt(fptr, exttype, status);

    return(*status);
}